

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void JX9_FILE_Const(jx9_value *pVal,void *pUserData)

{
  long lVar1;
  ulong uVar2;
  jx9_vm *pVm;
  
  if ((*(int *)((long)pUserData + 0x3f0) != 0) &&
     (lVar1 = *(long *)((long)pUserData + 1000), lVar1 != 0)) {
    uVar2 = (ulong)(uint)((*(int *)((long)pUserData + 0x3f0) + -1) *
                         *(int *)((long)pUserData + 0x3f8));
    jx9_value_string(pVal,*(char **)(lVar1 + uVar2),*(int *)(lVar1 + 8 + uVar2));
    return;
  }
  jx9_value_string(pVal,":MEMORY:",8);
  return;
}

Assistant:

static void JX9_FILE_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	SyString *pFile;
	/* Peek the top entry */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile == 0 ){
		/* Expand the magic word: ":MEMORY:" */
		jx9_value_string(pVal, ":MEMORY:", (int)sizeof(":MEMORY:")-1);
	}else{
		jx9_value_string(pVal, pFile->zString, pFile->nByte);
	}
}